

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_7zip.c
# Opt level: O1

void test_read_format_7zip_lzma2_riscv(void)

{
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                 ,L'ՙ');
  test_skipping("This version of liblzma does not support LZMA_FILTER_RISCV");
  return;
}

Assistant:

DEFINE_TEST(test_read_format_7zip_lzma2_riscv)
{
#ifdef LZMA_FILTER_RISCV
	struct archive *a;

	assert((a = archive_read_new()) != NULL);

	if (ARCHIVE_OK != archive_read_support_filter_lzma(a)) {
		skipping("7zip:lzma decoding is not supported on this platform");
	} else {
		test_riscv_filter("test_read_format_7zip_lzma2_riscv.7z");
	}
#else
	skipping("This version of liblzma does not support LZMA_FILTER_RISCV");
#endif
}